

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Promise<void> kj::yieldUntilQueueEmpty(void)

{
  int iVar1;
  PromiseBase in_RDI;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_10;
  
  if (yieldUntilQueueEmpty()::NODE == '\0') {
    iVar1 = __cxa_guard_acquire(&yieldUntilQueueEmpty()::NODE);
    if (iVar1 != 0) {
      __cxa_atexit(AsyncObject::~AsyncObject,&yieldUntilQueueEmpty::NODE,&__dso_handle);
      __cxa_guard_release(&yieldUntilQueueEmpty()::NODE);
    }
  }
  *(YieldUntilQueueEmptyPromiseNode **)in_RDI.node.ptr = &yieldUntilQueueEmpty::NODE;
  local_10.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_10);
  return (Promise<void>)(PromiseNode *)in_RDI.node.ptr;
}

Assistant:

Promise<void> yieldUntilQueueEmpty() {
  class YieldUntilQueueEmptyPromiseNode final: public _::PromiseNode {
  public:
    void destroy() override {}

    void onReady(_::Event* event) noexcept override {
      if (event) event->armLast();
    }
    void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }
    void tracePromise(_::TraceBuilder& builder, bool stopAtNextEvent) override {
      builder.add(reinterpret_cast<void*>(&kj::yieldUntilQueueEmpty));
    }
  };

  static YieldUntilQueueEmptyPromiseNode NODE;
  return _::PromiseNode::to<Promise<void>>(_::OwnPromiseNode(&NODE));
}